

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O0

shared_ptr<mocker::nasm::EffectiveAddr>
mocker::nasm::dyc<mocker::nasm::EffectiveAddr,std::shared_ptr<mocker::nasm::Addr>const&>
          (shared_ptr<mocker::nasm::Addr> *v)

{
  shared_ptr<mocker::nasm::EffectiveAddr> sVar1;
  shared_ptr<mocker::nasm::Addr> *v_local;
  
  sVar1 = std::dynamic_pointer_cast<mocker::nasm::EffectiveAddr,mocker::nasm::Addr>(v);
  sVar1.super___shared_ptr<mocker::nasm::EffectiveAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)v;
  return (shared_ptr<mocker::nasm::EffectiveAddr>)
         sVar1.super___shared_ptr<mocker::nasm::EffectiveAddr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dyc(V &&v) {
  return std::dynamic_pointer_cast<T>(v);
}